

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O1

uint32 * rw::ps2::instanceUV2(uint32 *p,Geometry *g,Mesh *m,uint32 idx,uint32 n)

{
  ushort uVar1;
  TexCoords *pTVar2;
  TexCoords *pTVar3;
  uint16 *puVar4;
  ulong uVar5;
  
  if (idx < n + idx) {
    pTVar2 = g->texCoords[0];
    pTVar3 = g->texCoords[1];
    puVar4 = m->indices;
    uVar5 = (ulong)idx;
    do {
      uVar1 = puVar4[uVar5];
      if (g->numTexCoordSets < 1) {
        ((float32 *)p)[0] = 0.0;
        ((float32 *)p)[1] = 0.0;
      }
      else {
        *p = (uint32)pTVar2[uVar1].u;
        ((float32 *)p)[1] = pTVar2[uVar1].v;
      }
      if (g->numTexCoordSets < 2) {
        ((float32 *)p)[2] = 0.0;
        ((float32 *)p)[3] = 0.0;
      }
      else {
        ((float32 *)p)[2] = pTVar3[uVar1].u;
        ((float32 *)p)[3] = pTVar3[uVar1].v;
      }
      p = (uint32 *)((float32 *)p + 4);
      uVar5 = uVar5 + 1;
    } while (n + idx != uVar5);
  }
  if (((ulong)p & 0xf) != 0) {
    uVar5 = (ulong)(0xcU - (int)p & 0xc);
    memset(p,0,uVar5 + 4);
    p = (uint32 *)((long)p + uVar5 + 4);
  }
  return (uint32 *)(float32 *)p;
}

Assistant:

uint32*
instanceUV2(uint32 *p, Geometry *g, Mesh *m, uint32 idx, uint32 n)
{
	uint16 j;
	uint32 *d0 = (uint32*)g->texCoords[0];
	uint32 *d1 = (uint32*)g->texCoords[1];
	for(uint32 i = idx; i < idx+n; i++){
		j = m->indices[i];
		if(g->numTexCoordSets > 0){
			*p++ = d0[j*2+0];
			*p++ = d0[j*2+1];
		}else{
			*p++ = 0;
			*p++ = 0;
		}
		if(g->numTexCoordSets > 1){
			*p++ = d1[j*2+0];
			*p++ = d1[j*2+1];
		}else{
			*p++ = 0;
			*p++ = 0;
		}
	}
	while((uintptr)p % 0x10)
		*p++ = 0;
	return p;
}